

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

IEngineGraphics * CreateEngineGraphicsThreaded(void)

{
  IEngineGraphics *pIVar1;
  
  pIVar1 = (IEngineGraphics *)operator_new(0x1241b8);
  (pIVar1->super_IGraphics).super_IInterface.m_pKernel = (IKernel *)0x0;
  (pIVar1->super_IGraphics).super_IInterface._vptr_IInterface =
       (_func_int **)&PTR__IInterface_00211258;
  pIVar1[0x733d].super_IGraphics.m_DesktopScreenHeight = -1;
  pIVar1[1].super_IGraphics.m_ScreenHeight = 0;
  pIVar1[1].super_IGraphics.m_DesktopScreenWidth = 0;
  pIVar1[1].super_IGraphics.m_DesktopScreenHeight = 0;
  pIVar1[1].super_IGraphics.m_ScreenHiDPIScale = 0.0;
  pIVar1[1].super_IGraphics.field_0x24 = 0;
  pIVar1[2].super_IGraphics.super_IInterface._vptr_IInterface = (_func_int **)0x0;
  pIVar1[2].super_IGraphics.super_IInterface.m_pKernel = (IKernel *)0x0;
  *(undefined8 *)&(pIVar1->super_IGraphics).field_0x24 = 0;
  *(undefined8 *)((long)&pIVar1[1].super_IGraphics.super_IInterface._vptr_IInterface + 4) =
       0xffffffff00000000;
  *(undefined4 *)&pIVar1[0x7337].super_IGraphics.super_IInterface.m_pKernel = 0;
  pIVar1[2].super_IGraphics.m_DesktopScreenWidth = 0;
  pIVar1[2].super_IGraphics.m_DesktopScreenHeight = 0;
  *(undefined8 *)&pIVar1[2].super_IGraphics.m_ScreenHiDPIScale = 0;
  *(undefined8 *)&pIVar1[2].super_IGraphics.field_0x24 = 0;
  *(undefined8 *)((long)&pIVar1[3].super_IGraphics.super_IInterface._vptr_IInterface + 4) = 0;
  (pIVar1->super_IGraphics).m_ScreenWidth = -1;
  (pIVar1->super_IGraphics).m_ScreenHeight = -1;
  pIVar1[0x733a].super_IGraphics.super_IInterface.m_pKernel = (IKernel *)0x0;
  pIVar1[0x74d7].super_IGraphics.m_DesktopScreenWidth = 0;
  *(undefined1 *)((long)&pIVar1[0x733a].super_IGraphics.super_IInterface._vptr_IInterface + 4) = 1;
  *(undefined1 *)&pIVar1[0x733a].super_IGraphics.m_ScreenWidth = 0;
  return pIVar1;
}

Assistant:

extern IEngineGraphics *CreateEngineGraphicsThreaded()
{
#ifdef CONF_HEADLESS_CLIENT
	return new CGraphics_ThreadedNull();
#else
	return new CGraphics_Threaded();
#endif
}